

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_ExpressionNot_x_iutest_x_Arithmetic_Test::Body(iu_ExpressionNot_x_iutest_x_Arithmetic_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1070;
  AssertionHelper local_1050;
  Fixed local_1020;
  int local_e94;
  int local_e90;
  int local_e8c;
  int local_e88;
  ExpressionDecomposer local_e81;
  ExpressionLHS<int> local_e80;
  ExpressionLHS<int> local_e58;
  ExpressionLHS<int> local_e30;
  ExpressionResult local_e08;
  AssertionResult local_de0;
  undefined1 local_db8 [8];
  AssertionResult iutest_ar_5;
  AssertionHelper local_d70;
  Fixed local_d40;
  int local_bb8 [3];
  ExpressionDecomposer local_ba9;
  ExpressionLHS<int> local_ba8;
  ExpressionLHS<int> local_b80;
  ExpressionResult local_b58;
  AssertionResult local_b30;
  undefined1 local_b08 [8];
  AssertionResult iutest_ar_4;
  AssertionHelper local_ac0;
  Fixed local_a90;
  int local_908 [3];
  ExpressionDecomposer local_8f9;
  ExpressionLHS<int> local_8f8;
  ExpressionLHS<int> local_8d0;
  ExpressionResult local_8a8;
  AssertionResult local_880;
  undefined1 local_858 [8];
  AssertionResult iutest_ar_3;
  AssertionHelper local_810;
  Fixed local_7e0;
  int local_658 [3];
  ExpressionDecomposer local_649;
  ExpressionLHS<int> local_648;
  ExpressionLHS<int> local_620;
  ExpressionResult local_5f8;
  AssertionResult local_5d0;
  undefined1 local_5a8 [8];
  AssertionResult iutest_ar_2;
  AssertionHelper local_560;
  Fixed local_530;
  int local_3a8 [3];
  ExpressionDecomposer local_399;
  ExpressionLHS<int> local_398;
  ExpressionLHS<int> local_370;
  ExpressionResult local_348;
  AssertionResult local_320;
  undefined1 local_2f8 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_2b0;
  Fixed local_280;
  int local_f8 [5];
  int local_e4;
  int local_e0;
  ExpressionDecomposer local_d9;
  ExpressionLHS<int> local_d8;
  ExpressionLHS<int> local_b0;
  ExpressionResult local_88;
  AssertionResult local_60;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_ExpressionNot_x_iutest_x_Arithmetic_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_e0 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_d8,&local_d9,&local_e0);
  local_e4 = 2;
  iutest::detail::ExpressionLHS<int>::operator+<int>(&local_b0,&local_d8,&local_e4);
  local_f8[0] = 1;
  iutest::detail::ExpressionLHS<int>::operator==(&local_88,&local_b0,local_f8);
  iutest::detail::ExpressionResult::GetResult(&local_60,&local_88,false);
  iutest::AssertionResult::Is((AssertionResult *)local_38,&local_60);
  iutest::AssertionResult::~AssertionResult(&local_60);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_88);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_b0);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_d8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_280,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_280);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_1.m_result,(internal *)local_38,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + 2 == 1))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x74,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_2b0,&local_280);
    iutest::AssertionHelper::~AssertionHelper(&local_2b0);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_280);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_3a8[2] = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_398,&local_399,local_3a8 + 2);
  local_3a8[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator-<int>(&local_370,&local_398,local_3a8 + 1);
  local_3a8[0] = 1;
  iutest::detail::ExpressionLHS<int>::operator==(&local_348,&local_370,local_3a8);
  iutest::detail::ExpressionResult::GetResult(&local_320,&local_348,false);
  iutest::AssertionResult::Is((AssertionResult *)local_2f8,&local_320);
  iutest::AssertionResult::~AssertionResult(&local_320);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_348);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_370);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_398);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    memset(&local_530,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_530);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_2.m_result,(internal *)local_2f8,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() - 2 == 1))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_560,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x75,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_560,&local_530);
    iutest::AssertionHelper::~AssertionHelper(&local_560);
    std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_530);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  iutest::detail::AlwaysZero();
  local_658[2] = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_648,&local_649,local_658 + 2);
  local_658[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator*<int>(&local_620,&local_648,local_658 + 1);
  local_658[0] = 1;
  iutest::detail::ExpressionLHS<int>::operator==(&local_5f8,&local_620,local_658);
  iutest::detail::ExpressionResult::GetResult(&local_5d0,&local_5f8,false);
  iutest::AssertionResult::Is((AssertionResult *)local_5a8,&local_5d0);
  iutest::AssertionResult::~AssertionResult(&local_5d0);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_5f8);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_620);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_648);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    memset(&local_7e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7e0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_3.m_result,(internal *)local_5a8,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() * 2 == 1))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_810,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x76,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_810,&local_7e0);
    iutest::AssertionHelper::~AssertionHelper(&local_810);
    std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  iutest::detail::AlwaysZero();
  local_908[2] = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_8f8,&local_8f9,local_908 + 2);
  local_908[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator/<int>(&local_8d0,&local_8f8,local_908 + 1);
  local_908[0] = 1;
  iutest::detail::ExpressionLHS<int>::operator==(&local_8a8,&local_8d0,local_908);
  iutest::detail::ExpressionResult::GetResult(&local_880,&local_8a8,false);
  iutest::AssertionResult::Is((AssertionResult *)local_858,&local_880);
  iutest::AssertionResult::~AssertionResult(&local_880);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_8a8);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_8d0);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_8f8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar1) {
    memset(&local_a90,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_a90);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_4.m_result,(internal *)local_858,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() / 2 == 1))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_ac0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x77,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_ac0,&local_a90);
    iutest::AssertionHelper::~AssertionHelper(&local_ac0);
    std::__cxx11::string::~string((string *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_a90);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  iutest::detail::AlwaysZero();
  local_bb8[2] = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_ba8,&local_ba9,local_bb8 + 2);
  local_bb8[1] = 4;
  iutest::detail::ExpressionLHS<int>::operator%<int>(&local_b80,&local_ba8,local_bb8 + 1);
  local_bb8[0] = 1;
  iutest::detail::ExpressionLHS<int>::operator==(&local_b58,&local_b80,local_bb8);
  iutest::detail::ExpressionResult::GetResult(&local_b30,&local_b58,false);
  iutest::AssertionResult::Is((AssertionResult *)local_b08,&local_b30);
  iutest::AssertionResult::~AssertionResult(&local_b30);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_b58);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_b80);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_ba8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b08);
  if (!bVar1) {
    memset(&local_d40,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_d40);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_5.m_result,(internal *)local_b08,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() % 4 == 1))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_d70,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x78,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_d70,&local_d40);
    iutest::AssertionHelper::~AssertionHelper(&local_d70);
    std::__cxx11::string::~string((string *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_d40);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_b08);
  iutest::detail::AlwaysZero();
  local_e88 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_e80,&local_e81,&local_e88);
  local_e8c = f();
  iutest::detail::ExpressionLHS<int>::operator+<int>(&local_e58,&local_e80,&local_e8c);
  local_e90 = f();
  iutest::detail::ExpressionLHS<int>::operator+<int>(&local_e30,&local_e58,&local_e90);
  local_e94 = 1;
  iutest::detail::ExpressionLHS<int>::operator==(&local_e08,&local_e30,&local_e94);
  iutest::detail::ExpressionResult::GetResult(&local_de0,&local_e08,false);
  iutest::AssertionResult::Is((AssertionResult *)local_db8,&local_de0);
  iutest::AssertionResult::~AssertionResult(&local_de0);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_e08);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_e30);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_e58);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_e80);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
  if (!bVar1) {
    memset(&local_1020,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1020);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1070,(internal *)local_db8,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + f() + f() == 1))",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_1050,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x79,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_1050,&local_1020);
    iutest::AssertionHelper::~AssertionHelper(&local_1050);
    std::__cxx11::string::~string((string *)&local_1070);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1020);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
  return;
}

Assistant:

IUTEST(ExpressionNot, Arithmetic)
{
    IUTEST_EXPECT_NOT(f() + 2 == 1);
    IUTEST_EXPECT_NOT(f() - 2 == 1);
    IUTEST_EXPECT_NOT(f() * 2 == 1);
    IUTEST_EXPECT_NOT(f() / 2 == 1);
    IUTEST_EXPECT_NOT(f() % 4 == 1);
    IUTEST_EXPECT_NOT(f() + f() + f() == 1);
}